

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_language_server.hpp
# Opt level: O3

void __thiscall
cmakels::cmake_language_server::cmake_language_server
          (cmake_language_server *this,string *build_directory)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->super_lsp_server)._vptr_lsp_server = (_func_int **)&PTR_initialize_006703b0;
  (this->super_TextDocumentService)._vptr_TextDocumentService = (_func_int **)&DAT_00670418;
  (this->root_path_)._M_dataplus._M_p = (pointer)&(this->root_path_).field_2;
  (this->root_path_)._M_string_length = 0;
  (this->root_path_).field_2._M_local_buf[0] = '\0';
  (this->build_directory_)._M_dataplus._M_p = (pointer)&(this->build_directory_).field_2;
  pcVar2 = (build_directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->build_directory_,pcVar2,pcVar2 + build_directory->_M_string_length);
  p_Var1 = &(this->open_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->open_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->open_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->open_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->open_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->open_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->query_).super__Optional_base<cmakels::cmake_query::cmake_query,_false,_false>._M_payload.
  super__Optional_payload<cmakels::cmake_query::cmake_query,_true,_false,_false>.
  super__Optional_payload_base<cmakels::cmake_query::cmake_query>._M_engaged = false;
  return;
}

Assistant:

cmake_language_server(std::string build_directory)
      : build_directory_{build_directory} {}